

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d63_q1a_hiatus.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  istream *piVar2;
  pointer ppVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  _Self local_b8;
  pair<int,_int> local_b0;
  _Self local_a8;
  iterator it2;
  iterator beg;
  pair<int,_int> local_90;
  _Self local_88;
  iterator it;
  int b_1;
  int a_1;
  pair<int,_int> local_64 [2];
  int local_50;
  int local_4c;
  int b;
  int a;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_> d
  ;
  int local_10;
  int m;
  int n;
  
  m = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (piVar2,(int *)((long)&d._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
       *)&b);
  while (iVar5 = local_10 + -1, bVar6 = local_10 != 0, local_10 = iVar5, bVar6) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_4c);
    std::istream::operator>>(piVar2,&local_50);
    local_64[0] = std::make_pair<int&,int&>(&local_4c,&local_50);
    std::
    set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
              *)&b,local_64);
  }
LAB_0010137d:
  do {
    while( true ) {
      if (d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
        d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1;
        std::
        set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
        ::~set((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)&b);
        return m;
      }
      d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
           d._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + -1;
      piVar2 = (istream *)
               std::istream::operator>>((istream *)&std::cin,(int *)((long)&it._M_node + 4));
      std::istream::operator>>(piVar2,(int *)&it);
      local_90 = std::make_pair<int&,int&>((int *)((long)&it._M_node + 4),(int *)&it);
      local_88._M_node =
           (_Base_ptr)
           std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&b,&local_90);
      beg = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&b);
      bVar6 = std::operator!=(&local_88,&beg);
      if (!bVar6) break;
      std::operator<<((ostream *)&std::cout,"0 0 ");
    }
    do {
      it2 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::begin((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)&b);
      iVar5 = it._M_node._4_4_;
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&it2);
      iVar1 = it._M_node._4_4_;
      if ((iVar5 < ppVar3->first) ||
         ((ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&it2),
          iVar5 = (int)it._M_node, iVar1 == ppVar3->first &&
          (ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&it2),
          iVar5 < ppVar3->second)))) {
        std::operator<<((ostream *)&std::cout,"-1 -1 ");
        goto LAB_0010137d;
      }
      if ((int)it._M_node + -1 < 1) {
        it._M_node._0_4_ = 0xc;
        it._M_node._4_4_ = it._M_node._4_4_ + -1;
      }
      else {
        it._M_node._0_4_ = (int)it._M_node + -1;
      }
      local_b0 = std::make_pair<int&,int&>((int *)((long)&it._M_node + 4),(int *)&it);
      local_a8._M_node =
           (_Base_ptr)
           std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                   *)&b,&local_b0);
      local_b8._M_node =
           (_Base_ptr)
           std::
           set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
           ::end((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  *)&b);
      bVar6 = std::operator!=(&local_a8,&local_b8);
    } while (!bVar6);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_a8);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ppVar3->first);
    poVar4 = std::operator<<(poVar4," ");
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<int,_int>_>::operator->(&local_a8);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->second);
    std::operator<<(poVar4," ");
  } while( true );
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int n, m;
    cin >> n >> m;
    set<pair<int, int>> d;

    while (n--) {
        int a, b;
        cin >> a >> b;

        d.insert(make_pair(a, b));
    }

    while (m--) {
        int a, b;
        cin >> a >> b;

        auto it = d.find(make_pair(a, b));
        if (it != d.end()) {
            cout << "0 0 ";
            continue;
        }

        while (true) {
            auto beg = d.begin();
            if (a < beg->first || ((a == beg->first) && b < beg->second)) {
                cout << "-1 -1 ";
                break;
            }

            if (b - 1 < 1) {
                b = 12;
                --a;
            } else {
                --b;
            }

            auto it2 = d.find(make_pair(a, b));
            if (it2 != d.end()) {
                cout << it2->first << " " << it2->second << " ";
                break;
            }
        }
    }
}